

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysutil.c
# Opt level: O0

int write_timeout(int fd,uint wait_seconds)

{
  int *piVar1;
  bool bVar2;
  fd_set *__arr;
  undefined1 auStack_a8 [4];
  uint __i;
  timeval timeout;
  fd_set write_fdset;
  int ret;
  uint wait_seconds_local;
  int fd_local;
  
  write_fdset.__fds_bits[0xf]._4_4_ = 0;
  if (wait_seconds != 0) {
    for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
      write_fdset.__fds_bits[(ulong)__arr._4_4_ - 1] = 0;
    }
    write_fdset.__fds_bits[(long)(fd / 0x40) + -1] =
         1L << ((byte)((long)fd % 0x40) & 0x3f) | write_fdset.__fds_bits[(long)(fd / 0x40) + -1];
    _auStack_a8 = (ulong)wait_seconds;
    timeout.tv_sec = 0;
    do {
      write_fdset.__fds_bits[0xf]._4_4_ =
           select(fd + 1,(fd_set *)0x0,(fd_set *)0x0,(fd_set *)&timeout.tv_usec,
                  (timeval *)auStack_a8);
      bVar2 = false;
      if (write_fdset.__fds_bits[0xf]._4_4_ < 0) {
        piVar1 = __errno_location();
        bVar2 = *piVar1 == 4;
      }
    } while (bVar2);
    if (write_fdset.__fds_bits[0xf]._4_4_ == 0) {
      write_fdset.__fds_bits[0xf]._4_4_ = -1;
      piVar1 = __errno_location();
      *piVar1 = 0x6e;
    }
    else if (write_fdset.__fds_bits[0xf]._4_4_ == 1) {
      write_fdset.__fds_bits[0xf]._4_4_ = 0;
    }
  }
  return write_fdset.__fds_bits[0xf]._4_4_;
}

Assistant:

int write_timeout(int fd, unsigned int wait_seconds) {
  int ret = 0;
  if (wait_seconds > 0) {
    fd_set write_fdset;
    struct timeval timeout;

    FD_ZERO(&write_fdset);
    FD_SET(fd, &write_fdset);

    timeout.tv_sec = wait_seconds;
    timeout.tv_usec = 0;
    do {
      ret = select(fd + 1, NULL, NULL, &write_fdset, &timeout);
    } while (ret < 0 && errno == EINTR);

    if (ret == 0) {
      ret = -1;
      errno = ETIMEDOUT;
    } else if (ret == 1)
      ret = 0;
  }

  return ret;
}